

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

tls_extension * bssl::tls_extension_find(uint32_t *out_index,uint16_t value)

{
  tls_extension *ptVar1;
  uint i;
  long lVar2;
  
  ptVar1 = (tls_extension *)&kExtensions;
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x1c) {
      return (tls_extension *)0x0;
    }
    if (ptVar1->value == value) break;
    lVar2 = lVar2 + 1;
    ptVar1 = ptVar1 + 1;
  }
  *out_index = (uint32_t)lVar2;
  return ptVar1;
}

Assistant:

static const struct tls_extension *tls_extension_find(uint32_t *out_index,
                                                      uint16_t value) {
  unsigned i;
  for (i = 0; i < kNumExtensions; i++) {
    if (kExtensions[i].value == value) {
      *out_index = i;
      return &kExtensions[i];
    }
  }

  return NULL;
}